

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.hpp
# Opt level: O1

void supermap::io::SerializeHelper<supermap::ByteArray<1UL>,_void>::serialize
               (ByteArray<1UL> *ar,ostream *os)

{
  IOException *this;
  long *plVar1;
  long *plVar2;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::ostream::write((char *)os,
                      (long)(ar->data_)._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  if (*(int *)(os + *(long *)(*(long *)os + -0x18) + 0x20) == 0) {
    return;
  }
  this = (IOException *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_60,1);
  std::operator+(&local_40,"Unsuccessful serialization, expected to write ",&local_60);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_80 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_80 == plVar2) {
    local_70 = *plVar2;
    lStack_68 = plVar1[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar2;
  }
  local_78 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  supermap::IOException::IOException(this,(string *)&local_80);
  __cxa_throw(this,&IOException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static void serialize(const ByteArray<Len> &ar, std::ostream &os) {
        os.write(ar.getCharsPointer(), Len);
        if (!os.good()) {
            throw IOException("Unsuccessful serialization, expected to write " + std::to_string(Len) + " bytes");
        }
    }